

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<33UL> * __thiscall
mserialize::cx_strcat<1ul,1ul,12ul,1ul,6ul,1ul,10ul,1ul>
          (cx_string<33UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<1UL> *strings_1,cx_string<12UL> *strings_2,cx_string<1UL> *strings_3,
          cx_string<6UL> *strings_4,cx_string<1UL> *strings_5,cx_string<10UL> *strings_6,
          cx_string<1UL> *strings_7)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ulong auStack_c8 [10];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined2 local_58;
  long lStack_48;
  mserialize *local_40;
  cx_string<1UL> *local_38;
  char buffer [34];
  
  puVar3 = &local_78;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_58 = 0;
  local_40 = this;
  local_38 = strings;
  buffer._0_8_ = strings_1;
  buffer._8_8_ = strings_2;
  buffer._16_8_ = strings_3;
  buffer._24_8_ = strings_4;
  stack0xfffffffffffffff0 = strings_5;
  lVar1 = 1;
  auStack_c8[1] = 1;
  auStack_c8[2] = 1;
  auStack_c8[3] = 0xc;
  auStack_c8[4] = 1;
  auStack_c8[5] = 6;
  auStack_c8[6] = 1;
  auStack_c8[7] = 10;
  auStack_c8[8] = 1;
  do {
    if (auStack_c8[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)puVar3 + uVar2) = *(undefined1 *)((&lStack_48)[lVar1] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < auStack_c8[lVar1]);
      puVar3 = (undefined8 *)((long)puVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 9);
  __return_storage_ptr__->_data[0x21] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = local_78;
  *(undefined8 *)(__return_storage_ptr__->_data + 8) = uStack_70;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x10) = local_68;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x18) = uStack_60;
  __return_storage_ptr__->_data[0x20] = (char)local_58;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}